

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenUnionCreator
          (PythonGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  BaseType BVar1;
  EnumVal *ev;
  pointer ppEVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string enum_fn;
  
  if ((enum_def->super_Definition).generated == false) {
    (*(this->namer_).super_Namer._vptr_Namer[6])(&enum_fn,&this->namer_,enum_def);
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_80,"def ",&enum_fn);
    std::operator+(&local_60,&local_80,"Creator(unionType, table):");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    GenIndents_abi_cxx11_(&local_80,this,1);
    std::operator+(&local_60,&local_80,"from flatbuffers.table import Table");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    GenIndents_abi_cxx11_(&local_80,this,1);
    std::operator+(&local_60,&local_80,"if not isinstance(table, Table):");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    GenIndents_abi_cxx11_(&local_80,this,2);
    std::operator+(&local_60,&local_80,"return None");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    for (ppEVar2 = (enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar2 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
      ev = *ppEVar2;
      BVar1 = (ev->union_type).base_type;
      if (BVar1 == BASE_TYPE_STRING) {
        GenUnionCreatorForString(this,enum_def,ev,code_ptr);
      }
      else if (BVar1 == BASE_TYPE_STRUCT) {
        GenUnionCreatorForStruct(this,enum_def,ev,code_ptr);
      }
    }
    GenIndents_abi_cxx11_(&local_80,this,1);
    std::operator+(&local_60,&local_80,"return None");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::~string((string *)&enum_fn);
  }
  return;
}

Assistant:

void GenUnionCreator(const EnumDef &enum_def, std::string *code_ptr) const {
    if (enum_def.generated) return;

    auto &code = *code_ptr;
    const auto enum_fn = namer_.Function(enum_def);

    code += "\n";
    code += "def " + enum_fn + "Creator(unionType, table):";
    code += GenIndents(1) + "from flatbuffers.table import Table";
    code += GenIndents(1) + "if not isinstance(table, Table):";
    code += GenIndents(2) + "return None";

    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      // Union only supports string and table.
      switch (ev.union_type.base_type) {
        case BASE_TYPE_STRUCT:
          GenUnionCreatorForStruct(enum_def, ev, &code);
          break;
        case BASE_TYPE_STRING:
          GenUnionCreatorForString(enum_def, ev, &code);
          break;
        default: break;
      }
    }
    code += GenIndents(1) + "return None";
    code += "\n";
  }